

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cpp
# Opt level: O0

void __thiscall random_test_main_Test::~random_test_main_Test(random_test_main_Test *this)

{
  random_test_main_Test *this_local;
  
  ~random_test_main_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(random_test, main) {
  static_assert(minstand_lcg<uint32_t>{}.rand(0) == unsigned_lcg(0),
                "[-][random_test] rand failed");
  static_assert(minstand_lcg<uint32_t>{}.rand(1) == unsigned_lcg(1),
                "[-][random_test] rand failed");
  static_assert(minstand_lcg<uint32_t>{}.rand(2, 0, 100) ==
                    (unsigned_lcg(2) % 100),
                "[-][random_test] rand failed");

  // runtime check
  minstand_lcg<uint32_t> gen;
  EXPECT_EQ(gen.rand(2), unsigned_lcg(2));
  EXPECT_EQ(gen.rand(3), unsigned_lcg(3));
  EXPECT_EQ(gen.rand(256), unsigned_lcg(256));
  EXPECT_EQ(gen.rand(256, 5, 128), 5 + unsigned_lcg(256) % (128 - 5));
}